

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printRemainingMessages
          (TapAssertionPrinter *this,Code colour)

{
  uint64_t count;
  bool bVar1;
  ostream *poVar2;
  pointer pMVar3;
  undefined8 *in_RDI;
  size_t N;
  const_iterator itEnd;
  ColourGuard *in_stack_ffffffffffffff18;
  ColourGuard *in_stack_ffffffffffffff20;
  pluralise *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  ColourImpl local_80;
  StringRef local_70;
  pluralise local_60 [2];
  uint64_t local_28;
  MessageInfo *local_20;
  MessageInfo *local_18;
  
  local_18 = (MessageInfo *)
             std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                       ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                        in_stack_ffffffffffffff18);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)in_stack_ffffffffffffff20,
                     (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)in_stack_ffffffffffffff18);
  if (!bVar1) {
    local_20 = (MessageInfo *)
               std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                          in_stack_ffffffffffffff18);
    local_28 = __gnu_cxx::operator-
                         ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                           *)in_stack_ffffffffffffff20,
                          (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                           *)in_stack_ffffffffffffff18);
    ColourImpl::guardColour
              ((ColourImpl *)in_stack_ffffffffffffff28,
               (Code)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    poVar2 = Catch::operator<<((ostream *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::operator<<(poVar2," with ");
    count = local_28;
    local_70 = operator____sr((char *)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
    pluralise::pluralise(local_60,count,local_70);
    poVar2 = Catch::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::operator<<(poVar2,':');
    ColourImpl::ColourGuard::~ColourGuard(in_stack_ffffffffffffff20);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_ffffffffffffff20,
                              (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_ffffffffffffff18), bVar1) {
      if (((*(byte *)(in_RDI + 4) & 1) != 0) ||
         (pMVar3 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator->((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                 *)(in_RDI + 3)), pMVar3->type != Info)) {
        poVar2 = std::operator<<((ostream *)*in_RDI," \'");
        pMVar3 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)(in_RDI + 3));
        poVar2 = std::operator<<(poVar2,(string *)&pMVar3->message);
        std::operator<<(poVar2,'\'');
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator++((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)(in_RDI + 3));
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                            *)in_stack_ffffffffffffff20,
                           (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                            *)in_stack_ffffffffffffff18);
        if (bVar1) {
          in_stack_ffffffffffffff20 = (ColourGuard *)*in_RDI;
          ColourImpl::guardColour(&local_80,(Code)((ulong)in_stack_ffffffffffffff20 >> 0x20));
          poVar2 = Catch::operator<<((ostream *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
          ;
          std::operator<<(poVar2," and");
          ColourImpl::ColourGuard::~ColourGuard(in_stack_ffffffffffffff20);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = tapDimColour) {
                if (itMessage == messages.end()) {
                    return;
                }

                // using messages.end() directly (or auto) yields compilation error:
                std::vector<MessageInfo>::const_iterator itEnd = messages.end();
                const std::size_t N = static_cast<std::size_t>(itEnd - itMessage);

                stream << colourImpl->guardColour( colour ) << " with "
                       << pluralise( N, "message"_sr ) << ':';

                for (; itMessage != itEnd; ) {
                    // If this assertion is a warning ignore any INFO messages
                    if (printInfoMessages || itMessage->type != ResultWas::Info) {
                        stream << " '" << itMessage->message << '\'';
                        if (++itMessage != itEnd) {
                            stream << colourImpl->guardColour(tapDimColour) << " and";
                        }
                    }
                }
            }